

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlVErrMemory(xmlValidCtxtPtr ctxt,char *extra)

{
  void *ctx;
  void *data;
  xmlGenericErrorFunc channel;
  char *msg;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctx = (void *)0x0;
    data = (void *)0x0;
    channel = (xmlGenericErrorFunc)0x0;
  }
  else {
    data = ctxt->userData;
    channel = ctxt->error;
    if ((ctxt->flags & 2) == 0) {
      ctx = (void *)0x0;
    }
    else {
      ctx = (void *)0x0;
      if (0xffffffffffffff06 < (ulong)((long)data - (long)ctxt)) {
        ctx = data;
      }
    }
  }
  if (extra == (char *)0x0) {
    msg = "Memory allocation failed\n";
    extra = (char *)0x0;
  }
  else {
    msg = "Memory allocation failed : %s\n";
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,channel,data,ctx,(void *)0x0,0x17,2,XML_ERR_FATAL,
                  (char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,msg);
  return;
}

Assistant:

static void
xmlVErrMemory(xmlValidCtxtPtr ctxt, const char *extra)
{
    xmlGenericErrorFunc channel = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        channel = ctxt->error;
        data = ctxt->userData;
	/* Look up flag to detect if it is part of a parsing
	   context */
	if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
	    long delta = (char *) ctxt - (char *) ctxt->userData;
	    if ((delta > 0) && (delta < 250))
		pctxt = ctxt->userData;
	}
    }
    if (extra)
        __xmlRaiseError(NULL, channel, data,
                        pctxt, NULL, XML_FROM_VALID, XML_ERR_NO_MEMORY,
                        XML_ERR_FATAL, NULL, 0, extra, NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(NULL, channel, data,
                        pctxt, NULL, XML_FROM_VALID, XML_ERR_NO_MEMORY,
                        XML_ERR_FATAL, NULL, 0, NULL, NULL, NULL, 0, 0,
                        "Memory allocation failed\n");
}